

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

void luckyCanonicizer_final_fast_16Vars1
               (word *pInOut,int nVars,int nWords,int *pStore,char *pCanonPerm,uint *pCanonPhase)

{
  uint uVar1;
  
  if (nVars - 7U < 10) {
    uVar1 = Kit_TruthSemiCanonicize_Yasha1(pInOut,nVars,pCanonPerm,pStore);
    *pCanonPhase = uVar1;
    luckyCanonicizerS_F_first_16Vars11(pInOut,nVars,nWords,pStore,pCanonPerm,pCanonPhase);
    bitReverceOrder(pInOut,nVars);
    *pCanonPhase = ~(-1 << ((byte)nVars & 0x1f) ^ *pCanonPhase);
    luckyCanonicizerS_F_first_16Vars11(pInOut,nVars,nWords,pStore,pCanonPerm,pCanonPhase);
    return;
  }
  __assert_fail("nVars > 6 && nVars <= 16",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyFast16.c"
                ,0x325,
                "void luckyCanonicizer_final_fast_16Vars1(word *, int, int, int *, char *, unsigned int *)"
               );
}

Assistant:

void luckyCanonicizer_final_fast_16Vars1(word* pInOut, int  nVars, int nWords, int * pStore, char * pCanonPerm, unsigned* pCanonPhase)
{   
    assert( nVars > 6 && nVars <= 16 );
    (* pCanonPhase) = Kit_TruthSemiCanonicize_Yasha1( pInOut, nVars, pCanonPerm, pStore );
    luckyCanonicizerS_F_first_16Vars11(pInOut, nVars, nWords, pStore, pCanonPerm, pCanonPhase ); 
    bitReverceOrder(pInOut, nVars);
    (*pCanonPhase) ^= (1<<nVars) -1;
    luckyCanonicizerS_F_first_16Vars11(pInOut, nVars, nWords, pStore, pCanonPerm, pCanonPhase );
//     bitReverceOrder(pInOut, nVars);
//     (*pCanonPhase) ^= (1<<nVars) -1;
//     luckyCanonicizerS_F_first_16Vars11(pInOut, nVars, nWords, pStore, pCanonPerm, pCanonPhase );
}